

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_classes.h
# Opt level: O3

void * object_alloc(t_class *c)

{
  undefined8 *x;
  object_inlets *this;
  mapped_type *this_00;
  t_mock_outlets mock_outlets;
  vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_> local_38;
  undefined8 *local_18;
  
  x = (undefined8 *)malloc(c->c_size);
  *x = c->c_messlist;
  x[1] = 0x68cebd9b;
  this = (object_inlets *)operator_new(0x20);
  c74::max::object_inlets::object_inlets(this,x);
  x[2] = this;
  local_38.super__Vector_base<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = x;
  this_00 = std::__detail::
            _Map_base<void_*,_std::pair<void_*const,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>,_std::allocator<std::pair<void_*const,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>,_std::allocator<std::pair<void_*const,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&c74::max::g_object_to_outletset,&local_18);
  std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>::operator=
            (this_00,&local_38);
  std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>::~vector(&local_38)
  ;
  return x;
}

Assistant:

MOCK_EXPORT void *object_alloc(t_class *c)
{
    t_object *o = (t_object*)malloc(c->c_size);

    o->o_messlist = c->c_messlist;
    o->o_magic = OB_MAGIC;
    o->o_inlet = (t_inlet*) new object_inlets(o);
    {
        t_mock_outlets	mock_outlets;

        // outlets are accessed through a global hash rather than by this struct member
        // this is because many outlet calls do not include the t_object pointer!
        // o->o_outlet = (struct outlet*) new t_mock_outlets;
        g_object_to_outletset[o] = mock_outlets;
    }
    return o;
}